

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_dp.c
# Opt level: O0

void MpiProvideTimeStep(CP_Services Svcs,DP_WS_Stream Stream_v,_SstData *Data,
                       _SstData *LocalMetadata,size_t TimeStep,void **TimeStepInfoPtr)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  void *pvVar3;
  undefined8 *in_RDX;
  long in_RSI;
  undefined8 in_R8;
  TimeStepsEntry Entry;
  MpiStreamWR Stream;
  
  puVar2 = (undefined8 *)calloc(0x18,1);
  pvVar3 = malloc(0x10);
  puVar2[1] = pvVar3;
  puVar1 = (undefined8 *)puVar2[1];
  *puVar1 = *in_RDX;
  puVar1[1] = in_RDX[1];
  *puVar2 = in_R8;
  pthread_rwlock_wrlock((pthread_rwlock_t *)(in_RSI + 0x40));
  puVar2[2] = 0;
  **(undefined8 **)(in_RSI + 0x28) = puVar2;
  *(undefined8 **)(in_RSI + 0x28) = puVar2 + 2;
  pthread_rwlock_unlock((pthread_rwlock_t *)(in_RSI + 0x40));
  return;
}

Assistant:

static void MpiProvideTimeStep(CP_Services Svcs, DP_WS_Stream Stream_v, struct _SstData *Data,
                               struct _SstData *LocalMetadata, size_t TimeStep,
                               void **TimeStepInfoPtr)
{
    MpiStreamWR Stream = (MpiStreamWR)Stream_v;
    TimeStepsEntry Entry = calloc(sizeof(struct _TimeStepsEntry), 1);

    Entry->Data = malloc(sizeof(struct _SstData));
    memcpy(Entry->Data, Data, sizeof(struct _SstData));
    Entry->TimeStep = TimeStep;

    pthread_rwlock_wrlock(&Stream->LockTS);
    STAILQ_INSERT_TAIL(&Stream->TimeSteps, Entry, entries);
    pthread_rwlock_unlock(&Stream->LockTS);
}